

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O0

int Str_MuxRestructureArea
              (Gia_Man_t *pNew,Str_Ntk_t *pNtk,int iMux,int nMuxes,Vec_Int_t *vDelay,int nLutSize,
              int fVerbose)

{
  int iVar1;
  undefined1 local_7d38 [4];
  int Result;
  Str_Mux_t pTree [500];
  int Limit;
  int nLutSize_local;
  Vec_Int_t *vDelay_local;
  int nMuxes_local;
  int iMux_local;
  Str_Ntk_t *pNtk_local;
  Gia_Man_t *pNew_local;
  
  pTree[499].Edge[2].FanDel = 500;
  if (nMuxes < 500) {
    pTree[499].Edge[2].Copy = nLutSize;
    if (499 < nMuxes) {
      __assert_fail("nMuxes < Limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x73b,
                    "int Str_MuxRestructureArea(Gia_Man_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int, int)"
                   );
    }
    Str_MuxCreate((Str_Mux_t *)local_7d38,pNtk,iMux,nMuxes,vDelay,nLutSize);
    iVar1 = Str_MuxRestructArea_rec
                      (pNew,(Str_Mux_t *)local_7d38,(Str_Mux_t *)local_7d38,0,vDelay,fVerbose);
    if ((iVar1 < 0) || (2 < iVar1)) {
      __assert_fail("Result >= 0 && Result <= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaStr.c"
                    ,0x73e,
                    "int Str_MuxRestructureArea(Gia_Man_t *, Str_Ntk_t *, int, int, Vec_Int_t *, int, int)"
                   );
    }
    pNew_local._4_4_ = Str_MuxToGia_rec(pNew,(Str_Mux_t *)local_7d38,0,vDelay);
  }
  else {
    pNew_local._4_4_ = -1;
  }
  return pNew_local._4_4_;
}

Assistant:

int Str_MuxRestructureArea( Gia_Man_t * pNew, Str_Ntk_t * pNtk, int iMux, int nMuxes, Vec_Int_t * vDelay, int nLutSize, int fVerbose )
{
    int Limit = 500;
    Str_Mux_t pTree[500];
    int Result;
    if ( nMuxes >= Limit )
        return -1;
    assert( nMuxes < Limit );
    Str_MuxCreate( pTree, pNtk, iMux, nMuxes, vDelay, nLutSize );
    Result = Str_MuxRestructArea_rec( pNew, pTree, pTree, 0, vDelay, fVerbose );
    assert( Result >= 0 && Result <= 2 );
    return Str_MuxToGia_rec( pNew, pTree, 0, vDelay );
}